

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void __thiscall
Units_flattenImportedUnitsWithNonStandardReferenceDirectlyWithExistingEquivalentUnitsWithDifferentNameThroughComponent_Test
::TestBody(Units_flattenImportedUnitsWithNonStandardReferenceDirectlyWithExistingEquivalentUnitsWithDifferentNameThroughComponent_Test
           *this)

{
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  element_type *peVar4;
  char *pcVar5;
  AssertHelper local_360 [8];
  Message local_358 [8];
  shared_ptr<libcellml::Component> local_350;
  shared_ptr<libcellml::Variable> local_340;
  shared_ptr<libcellml::Units> local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  undefined1 local_300 [8];
  AssertionResult gtest_ar_4;
  Message local_2e8 [8];
  shared_ptr<libcellml::Units> local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  undefined1 local_2b0 [8];
  AssertionResult gtest_ar_3;
  Message local_298 [8];
  shared_ptr<libcellml::Units> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  undefined1 local_260 [8];
  AssertionResult gtest_ar_2;
  Message local_248 [8];
  shared_ptr<libcellml::Units> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  undefined1 local_210 [8];
  AssertionResult gtest_ar_1;
  Message local_1f8 [8];
  unsigned_long local_1f0 [2];
  undefined1 local_1e0 [8];
  AssertionResult gtest_ar;
  ModelPtr flatModel;
  string local_1b8 [39];
  allocator<char> local_191;
  string local_190 [39];
  allocator<char> local_169;
  string local_168 [39];
  allocator<char> local_141;
  string local_140 [32];
  undefined1 local_120 [8];
  UnitsPtr u;
  string local_108 [39];
  allocator<char> local_e1;
  string local_e0 [32];
  undefined1 local_c0 [8];
  ComponentPtr ic;
  string local_a8 [32];
  undefined1 local_88 [8];
  ModelPtr model;
  allocator<char> local_61;
  string local_60 [32];
  undefined1 local_40 [8];
  ImportSourcePtr import;
  ImporterPtr importer;
  ModelPtr importModel;
  Units_flattenImportedUnitsWithNonStandardReferenceDirectlyWithExistingEquivalentUnitsWithDifferentNameThroughComponent_Test
  *this_local;
  
  std::shared_ptr<libcellml::Model>::shared_ptr
            ((shared_ptr<libcellml::Model> *)
             &importer.super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  libcellml::Importer::create((bool)((char)&import + '\b'));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_60,"importer/units/base_model.cellml",&local_61);
  createBaseModelImport
            ((ModelPtr *)local_40,
             (string *)
             &importer.super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator(&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_a8,"main_model",
             (allocator<char> *)
             ((long)&ic.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Model::create((string *)local_88);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&ic.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_e0,"my_component",&local_e1);
  libcellml::Component::create((string *)local_c0);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator(&local_e1);
  peVar2 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_c0);
  libcellml::ImportedEntity::setImportSource((shared_ptr *)(peVar2 + 0x10));
  peVar2 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_108,"my_component",
             (allocator<char> *)
             ((long)&u.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi + 7));
  libcellml::ImportedEntity::setImportReference((string *)(peVar2 + 0x10));
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&u.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_140,"femtomole",&local_141);
  libcellml::Units::create((string *)local_120);
  std::__cxx11::string::~string(local_140);
  std::allocator<char>::~allocator(&local_141);
  peVar3 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_120);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_168,"mole",&local_169);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_190,"femto",&local_191);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1b8,"",
             (allocator<char> *)
             ((long)&flatModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Units::addUnit((string *)peVar3,local_168,1.0,1.0,local_190);
  std::__cxx11::string::~string(local_1b8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&flatModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator(&local_191);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator(&local_169);
  peVar4 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_88);
  libcellml::ComponentEntity::addComponent((shared_ptr *)peVar4);
  peVar4 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_88);
  libcellml::Model::addUnits((shared_ptr *)peVar4);
  std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &import.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  libcellml::Importer::flattenModel((shared_ptr *)&gtest_ar.message_);
  local_1f0[1] = 2;
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &gtest_ar.message_);
  local_1f0[0] = libcellml::Model::unitsCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_1e0,"size_t(2)","flatModel->unitsCount()",local_1f0 + 1,
             local_1f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e0);
  if (!bVar1) {
    testing::Message::Message(local_1f8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_1e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0xc49,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_1f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e0);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &gtest_ar.message_);
  libcellml::Model::units((ulong)&local_240);
  std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_240);
  libcellml::NamedEntity::name_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[10],std::__cxx11::string>
            ((EqHelper<false> *)local_210,"\"femtomole\"","flatModel->units(0)->name()",
             (char (*) [10])"femtomole",&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  std::shared_ptr<libcellml::Units>::~shared_ptr(&local_240);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_210);
  if (!bVar1) {
    testing::Message::Message(local_248);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_210);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0xc4a,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(local_248);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &gtest_ar.message_);
  libcellml::Model::units((ulong)&local_290);
  std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_290);
  libcellml::NamedEntity::name_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[9],std::__cxx11::string>
            ((EqHelper<false> *)local_260,"\"per_fmol\"","flatModel->units(1)->name()",
             (char (*) [9])"per_fmol",&local_280);
  std::__cxx11::string::~string((string *)&local_280);
  std::shared_ptr<libcellml::Units>::~shared_ptr(&local_290);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_260);
  if (!bVar1) {
    testing::Message::Message(local_298);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_260);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0xc4b,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,local_298);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(local_298);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_260);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &gtest_ar.message_);
  libcellml::Model::units((ulong)&local_2e0);
  std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_2e0);
  libcellml::Units::unitAttributeReference_abi_cxx11_((ulong)&local_2d0);
  testing::internal::EqHelper<false>::Compare<char[10],std::__cxx11::string>
            ((EqHelper<false> *)local_2b0,"\"femtomole\"",
             "flatModel->units(1)->unitAttributeReference(0)",(char (*) [10])"femtomole",&local_2d0)
  ;
  std::__cxx11::string::~string((string *)&local_2d0);
  std::shared_ptr<libcellml::Units>::~shared_ptr(&local_2e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b0);
  if (!bVar1) {
    testing::Message::Message(local_2e8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_2b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0xc4c,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,local_2e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(local_2e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b0);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &gtest_ar.message_);
  libcellml::ComponentEntity::component((ulong)&local_350);
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_350);
  libcellml::Component::variable((ulong)&local_340);
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_340);
  libcellml::Variable::units();
  std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_330);
  libcellml::NamedEntity::name_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[9],std::__cxx11::string>
            ((EqHelper<false> *)local_300,"\"per_fmol\"",
             "flatModel->component(0)->variable(0)->units()->name()",(char (*) [9])"per_fmol",
             &local_320);
  std::__cxx11::string::~string((string *)&local_320);
  std::shared_ptr<libcellml::Units>::~shared_ptr(&local_330);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_340);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_350);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_300);
  if (!bVar1) {
    testing::Message::Message(local_358);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_300);
    testing::internal::AssertHelper::AssertHelper
              (local_360,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0xc4d,pcVar5);
    testing::internal::AssertHelper::operator=(local_360,local_358);
    testing::internal::AssertHelper::~AssertHelper(local_360);
    testing::Message::~Message(local_358);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_300);
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)&gtest_ar.message_)
  ;
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_120);
  std::shared_ptr<libcellml::Component>::~shared_ptr((shared_ptr<libcellml::Component> *)local_c0);
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_88);
  std::shared_ptr<libcellml::ImportSource>::~shared_ptr
            ((shared_ptr<libcellml::ImportSource> *)local_40);
  std::shared_ptr<libcellml::Importer>::~shared_ptr
            ((shared_ptr<libcellml::Importer> *)
             &import.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::shared_ptr<libcellml::Model>::~shared_ptr
            ((shared_ptr<libcellml::Model> *)
             &importer.super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

TEST(Units, flattenImportedUnitsWithNonStandardReferenceDirectlyWithExistingEquivalentUnitsWithDifferentNameThroughComponent)
{
    libcellml::ModelPtr importModel;
    libcellml::ImporterPtr importer = libcellml::Importer::create();
    libcellml::ImportSourcePtr import = createBaseModelImport(importModel, "importer/units/base_model.cellml");

    libcellml::ModelPtr model = libcellml::Model::create("main_model");

    libcellml::ComponentPtr ic = libcellml::Component::create("my_component");
    ic->setImportSource(import);
    ic->setImportReference("my_component");

    libcellml::UnitsPtr u = libcellml::Units::create("femtomole");
    u->addUnit("mole", "femto");

    model->addComponent(ic);
    model->addUnits(u);

    auto flatModel = importer->flattenModel(model);

    EXPECT_EQ(size_t(2), flatModel->unitsCount());
    EXPECT_EQ("femtomole", flatModel->units(0)->name());
    EXPECT_EQ("per_fmol", flatModel->units(1)->name());
    EXPECT_EQ("femtomole", flatModel->units(1)->unitAttributeReference(0));
    EXPECT_EQ("per_fmol", flatModel->component(0)->variable(0)->units()->name());
}